

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Reader::readCppStyleComment(Reader *this)

{
  Char CVar1;
  Reader *in_RDI;
  Char c;
  
  while( true ) {
    if (in_RDI->current_ == in_RDI->end_) {
      return true;
    }
    CVar1 = getNextChar(in_RDI);
    if (CVar1 == '\r') break;
    if (CVar1 == '\n') {
      return true;
    }
  }
  return true;
}

Assistant:

bool Reader::readCppStyleComment() {
  while (current_ != end_) {
    Char c = getNextChar();
    if (c == '\r' || c == '\n')
      break;
  }
  return true;
}